

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void string_suite::test_escape_reverse_solidus(void)

{
  char input [5];
  string value;
  iarchive in;
  allocator<char> local_1a1;
  char local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_iarchive<char> local_178;
  
  builtin_strncpy(local_1a0,"\"\\\\\"",5);
  local_198._M_dataplus._M_p = (pointer)strlen(local_1a0);
  local_198._M_string_length = (size_type)local_1a0;
  trial::protocol::json::basic_iarchive<char>::basic_iarchive(&local_178,(view_type *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"EMPTY",&local_1a1);
  trial::protocol::json::basic_iarchive<char>::load<std::__cxx11::string>(&local_178,&local_198);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("value","\"\\\\\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0xef,"void string_suite::test_escape_reverse_solidus()",&local_198,"\\");
  std::__cxx11::string::~string((string *)&local_198);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive(&local_178);
  return;
}

Assistant:

void test_escape_reverse_solidus()
{
    const char input[] = "\"\\\\\"";
    json::iarchive in(input);
    std::string value("EMPTY");
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, "\\");
}